

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# naive_vector_column.h
# Opt level: O3

bool __thiscall
Gudhi::persistence_matrix::
Naive_vector_column<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)4,true,false,false>>,std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)4,true,false,false>>>*,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)4,true,false,false>>>*>>>
::
_add<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)4,true,false,false>>,std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)4,true,false,false>>>*,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)4,true,false,false>>>*>>>>
          (Naive_vector_column<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)4,true,false,false>>,std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)4,true,false,false>>>*,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)4,true,false,false>>>*>>>
           *this,Naive_vector_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>,_std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*>_>_>
                 *column)

{
  uint uVar1;
  pointer ppEVar2;
  pointer ppEVar3;
  vector<std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>,_Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_>_>,_std::allocator<std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>,_Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_>_>_>_>
  *this_00;
  bool bVar4;
  Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>
  *__v;
  pointer psVar5;
  ulong uVar6;
  pointer ppEVar7;
  Column_support newColumn;
  anon_class_1_0_00000001 local_79;
  vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*>_>
  local_78;
  anon_class_8_1_d68037b6 local_60;
  anon_class_8_1_d68037b6 local_58;
  anon_class_16_2_26534583 local_50;
  anon_class_16_2_90bf7f7f local_40;
  
  ppEVar7 = (column->column_).
            super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  ppEVar2 = (column->column_).
            super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (ppEVar7 == ppEVar2) {
    bVar4 = false;
  }
  else if (*(long *)(this + 0x10) == *(long *)(this + 0x18)) {
    std::
    vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*>_>
    ::resize((vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*>_>
              *)(this + 0x10),(long)ppEVar2 - (long)ppEVar7 >> 3);
    ppEVar7 = (column->column_).
              super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    ppEVar2 = (column->column_).
              super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    bVar4 = true;
    if (ppEVar7 != ppEVar2) {
      uVar6 = 0;
      do {
        uVar1 = (*ppEVar7)->rowIndex_;
        __v = (Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>
               *)operator_new(8);
        (__v->super_Entry_column_index_option).columnIndex_ = *(uint *)this;
        __v->rowIndex_ = uVar1;
        *(Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>
          **)(*(long *)(this + 0x10) + uVar6 * 8) = __v;
        this_00 = *(vector<std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>,_Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_>_>,_std::allocator<std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>,_Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_>_>_>_>
                    **)(this + 8);
        if (this_00 !=
            (vector<std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>,_Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_>_>,_std::allocator<std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>,_Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_>_>_>_>
             *)0x0) {
          psVar5 = (this_00->
                   super__Vector_base<std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>,_Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_>_>,_std::allocator<std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>,_Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          if ((ulong)(((long)(this_00->
                             super__Vector_base<std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>,_Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_>_>,_std::allocator<std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>,_Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_finish - (long)psVar5 >> 4) *
                     -0x5555555555555555) < (ulong)(uVar1 + 1)) {
            std::
            vector<std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>,_Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_>_>,_std::allocator<std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>,_Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_>_>_>_>
            ::resize(this_00,(ulong)(uVar1 + 1));
            psVar5 = (pointer)**(undefined8 **)(this + 8);
          }
          std::
          _Rb_tree<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)4,true,false,false>>>,Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)4,true,false,false>>>,std::_Identity<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)4,true,false,false>>>>,Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)4,true,false,false>>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)4,true,false,false>>>>,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)4,true,false,false>>>>>
          ::
          _M_insert_unique<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)4,true,false,false>>>const&>
                    ((_Rb_tree<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)4,true,false,false>>>,Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)4,true,false,false>>>,std::_Identity<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)4,true,false,false>>>>,Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)4,true,false,false>>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)4,true,false,false>>>>,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)4,true,false,false>>>>>
                      *)(psVar5 + uVar1),__v);
        }
        ppEVar7 = ppEVar7 + 1;
        uVar6 = (ulong)((int)uVar6 + 1);
      } while (ppEVar7 != ppEVar2);
      bVar4 = true;
    }
  }
  else {
    local_78.
    super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_78.
    super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_78.
    super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::
    vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*>_>
    ::reserve(&local_78,
              ((long)ppEVar2 - (long)ppEVar7 >> 3) +
              (*(long *)(this + 0x18) - *(long *)(this + 0x10) >> 3));
    local_60.newColumn = &local_78;
    local_58.newColumn = &local_78;
    local_50.this =
         (Naive_vector_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>,_std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*>_>_>
          *)this;
    local_50.newColumn = &local_78;
    local_40.newColumn = &local_78;
    local_40.this =
         (Naive_vector_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>,_std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*>_>_>
          *)this;
    bVar4 = _generic_add_to_column<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)4,true,false,false>>,std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)4,true,false,false>>>*,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)4,true,false,false>>>*>>>,Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)4,true,false,false>>,std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)4,true,false,false>>>*,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)4,true,false,false>>>*>>>,Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix___atrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)4,true,false,false>>>*>>>___1_>
                      (column,(Naive_vector_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>,_std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*>_>_>
                               *)this,&local_58,&local_40,&local_79,&local_60,&local_50);
    ppEVar7 = *(pointer *)(this + 0x10);
    ppEVar2 = *(pointer *)(this + 0x18);
    ppEVar3 = *(pointer *)(this + 0x20);
    *(pointer *)(this + 0x10) =
         local_78.
         super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*>_>
         ._M_impl.super__Vector_impl_data._M_start;
    *(pointer *)(this + 0x18) =
         local_78.
         super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    *(pointer *)(this + 0x20) =
         local_78.
         super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    if (ppEVar7 != (pointer)0x0) {
      local_78.
      super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*>_>
      ._M_impl.super__Vector_impl_data._M_start = ppEVar7;
      local_78.
      super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*>_>
      ._M_impl.super__Vector_impl_data._M_finish = ppEVar2;
      local_78.
      super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = ppEVar3;
      operator_delete(ppEVar7,(long)ppEVar3 - (long)ppEVar7);
    }
  }
  return bVar4;
}

Assistant:

inline bool Naive_vector_column<Master_matrix,Support>::_add(const Entry_range& column)
{
  if (column.begin() == column.end()) return false;
  if (column_.empty()) {  // chain should never enter here.
    column_.resize(column.size());
    Index i = 0;
    for (const Entry& entry : column) {
      if constexpr (Master_matrix::Option_list::is_z2) {
        _update_entry(entry.get_row_index(), i++);
      } else {
        _update_entry(entry.get_element(), entry.get_row_index(), i++);
      }
    }
    return true;
  }

  Column_support newColumn;
  newColumn.reserve(column_.size() + column.size());  // safe upper bound

  auto pivotIsZeroed = _generic_add_to_column(
      column,
      *this,
      [&](Entry* entryTarget) { newColumn.push_back(entryTarget); },
      [&](typename Entry_range::const_iterator& itSource,
          [[maybe_unused]] const typename Column_support::iterator& itTarget) {
        if constexpr (Master_matrix::Option_list::is_z2) {
          _insert_entry(itSource->get_row_index(), newColumn);
        } else {
          _insert_entry(itSource->get_element(), itSource->get_row_index(), newColumn);
        }
      },
      [&](Field_element& targetElement, typename Entry_range::const_iterator& itSource) {
        if constexpr (!Master_matrix::Option_list::is_z2)
          operators_->add_inplace(targetElement, itSource->get_element());
      },
      [&](Entry* entryTarget) { newColumn.push_back(entryTarget); },
      [&](typename Column_support::iterator& itTarget) {
        while (itTarget != column_.end()) {
          newColumn.push_back(*itTarget);
          itTarget++;
        }
      });

  column_.swap(newColumn);

  return pivotIsZeroed;
}